

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimeinfo.cpp
# Opt level: O0

uint64_t __thiscall hbm::streaming::deltaTimeInfo::increment(deltaTimeInfo *this,uint count)

{
  ulong uVar1;
  uint64_t uVar2;
  uint in_ESI;
  long *in_RDI;
  uint64_t delta;
  
  in_RDI[2] = in_RDI[1] * (ulong)in_ESI + in_RDI[2];
  uVar1 = in_RDI[2];
  in_RDI[2] = in_RDI[2] & 0xffffffff;
  uVar2 = timeInfo::add((timeInfo *)(in_RDI + 3),(uVar1 >> 0x20) + *in_RDI * (ulong)in_ESI);
  return uVar2;
}

Assistant:

uint64_t deltaTimeInfo::increment(unsigned int count)
		{
			uint64_t delta = m_deltaNtpTimestamp*count;

			// transfer sub fraction overflow to fractions
			m_deltaSubFractionCollected += m_deltaSubFraction * count;
			delta += (m_deltaSubFractionCollected >> 32) & UINT32_MAX;
			// remove overflow that was added to the fractions
			m_deltaSubFractionCollected &= UINT32_MAX;

			return m_time.add(delta);
		}